

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

ForNonContainerNonPointer<double,_std::string> *
lest::to_string<double>
          (ForNonContainerNonPointer<double,_std::string> *__return_storage_ptr__,double *value)

{
  uint *puVar1;
  ostringstream os;
  long local_190 [3];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::ostream::_M_insert<double>(*value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

inline auto to_string( T const & value ) -> ForNonContainerNonPointer<T, std::string>
{
    std::ostringstream os; os << std::boolalpha << value; return os.str();
}